

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hblas1.cxx
# Opt level: O0

void HBLAS1::HBLAS1V::hblas1_swapv_invoker(void)

{
  undefined8 uVar1;
  basic_wrap_stringstream<char> *this;
  basic_wrap_stringstream<char> *s;
  basic_wrap_stringstream<char> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  hblas1_swapv t;
  char (*in_stack_fffffffffffff618) [19];
  basic_wrap_stringstream<char> *in_stack_fffffffffffff620;
  std_string *in_stack_fffffffffffff628;
  basic_cstring<const_char> *in_stack_fffffffffffff630;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff640;
  basic_wrap_stringstream<char> *this_01;
  undefined1 local_8c8 [64];
  undefined1 local_888 [64];
  undefined1 local_848 [64];
  undefined1 local_808 [64];
  undefined1 local_7c8 [64];
  undefined1 auStack_788 [24];
  undefined1 local_770 [40];
  undefined1 auStack_748 [24];
  undefined1 local_730 [16];
  basic_cstring<const_char> local_720;
  undefined1 local_709;
  undefined1 local_708 [64];
  hblas1_swapv *local_6c8;
  hblas1_swapv *this_02;
  undefined1 local_570 [16];
  basic_cstring<const_char> local_560;
  undefined1 local_549;
  undefined1 local_548 [64];
  undefined1 local_508 [64];
  undefined1 local_4c8 [64];
  undefined1 local_488 [64];
  undefined1 local_448 [64];
  undefined1 auStack_408 [24];
  undefined1 local_3f0 [40];
  undefined1 auStack_3c8 [24];
  undefined1 local_3b0 [16];
  basic_cstring<const_char> local_3a0;
  undefined1 local_389;
  undefined1 local_388 [64];
  undefined1 local_348 [64];
  undefined1 local_308 [64];
  undefined1 local_2c8 [64];
  undefined1 local_288 [64];
  undefined1 auStack_248 [24];
  undefined1 local_230 [40];
  undefined1 auStack_208 [24];
  undefined1 local_1e8 [16];
  basic_cstring<const_char> local_1d8;
  undefined1 local_1c5;
  undefined1 local_1b8 [64];
  undefined1 local_178 [64];
  undefined1 local_138 [64];
  undefined1 local_f8 [64];
  undefined1 local_b8 [64];
  undefined1 auStack_78 [24];
  undefined1 local_60 [40];
  undefined1 auStack_38 [24];
  undefined1 local_20 [16];
  basic_cstring<const_char> local_10;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  this_02 = local_6c8;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_10,
             "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas1.cxx"
             ,0x58);
  auVar3 = ZEXT1664((undefined1  [16])0x0);
  auVar4 = vmovdqu64_avx512f(auVar3);
  auStack_38 = auVar4._40_24_;
  auVar4 = vmovdqu64_avx512f(auVar3);
  auStack_78 = auVar4._0_24_;
  local_60 = auVar4._24_40_;
  local_b8 = vmovdqu64_avx512f(auVar3);
  local_f8 = vmovdqu64_avx512f(auVar3);
  local_138 = vmovdqu64_avx512f(auVar3);
  local_178 = vmovdqu64_avx512f(auVar3);
  local_1b8 = vmovdqu64_avx512f(auVar3);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_1b8);
  local_1c5 = 0x22;
  boost::operator<<(in_stack_fffffffffffff620,*in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,(char (*) [13])in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,(char (*) [15])in_stack_fffffffffffff618);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff640);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_10,0x12,local_20);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff620);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_1d8,
             "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas1.cxx"
             ,0x58);
  auVar3 = ZEXT1664((undefined1  [16])0x0);
  auVar4 = vmovdqu64_avx512f(auVar3);
  auStack_208 = auVar4._40_24_;
  auVar4 = vmovdqu64_avx512f(auVar3);
  auStack_248 = auVar4._0_24_;
  local_230 = auVar4._24_40_;
  local_288 = vmovdqu64_avx512f(auVar3);
  local_2c8 = vmovdqu64_avx512f(auVar3);
  local_308 = vmovdqu64_avx512f(auVar3);
  local_348 = vmovdqu64_avx512f(auVar3);
  local_388 = vmovdqu64_avx512f(auVar3);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_388);
  local_389 = 0x22;
  boost::operator<<(in_stack_fffffffffffff620,*in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,(char (*) [13])in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,(char (*) [16])in_stack_fffffffffffff618);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff640);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1d8,0x12,local_1e8);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::unit_test::setup_conditional<HBLAS1::HBLAS1V::hblas1_swapv>
            ((hblas1_swapv *)in_stack_fffffffffffff620);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_3a0,
             "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas1.cxx"
             ,0x58);
  auVar3 = ZEXT1664((undefined1  [16])0x0);
  auVar4 = vmovdqu64_avx512f(auVar3);
  auStack_3c8 = auVar4._40_24_;
  auVar4 = vmovdqu64_avx512f(auVar3);
  auStack_408 = auVar4._0_24_;
  local_3f0 = auVar4._24_40_;
  local_448 = vmovdqu64_avx512f(auVar3);
  local_488 = vmovdqu64_avx512f(auVar3);
  local_4c8 = vmovdqu64_avx512f(auVar3);
  local_508 = vmovdqu64_avx512f(auVar3);
  local_548 = vmovdqu64_avx512f(auVar3);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_548);
  local_549 = 0x22;
  boost::operator<<(in_stack_fffffffffffff620,*in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,(char (*) [13])in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,(char (*) [13])in_stack_fffffffffffff618);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff640);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3a0,0x12,local_3b0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff620);
  hblas1_swapv::test_method(this_02);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_560,
             "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas1.cxx"
             ,0x58);
  auVar4 = ZEXT1664((undefined1  [16])0x0);
  vmovdqu64_avx512f(auVar4);
  vmovdqu64_avx512f(auVar4);
  vmovdqu64_avx512f(auVar4);
  vmovdqu64_avx512f(auVar4);
  vmovdqu64_avx512f(auVar4);
  vmovdqu64_avx512f(auVar4);
  local_708 = vmovdqu64_avx512f(auVar4);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_708);
  local_709 = 0x22;
  boost::operator<<(in_stack_fffffffffffff620,*in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,(char (*) [13])in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff640);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_560,0x12,local_570);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::unit_test::teardown_conditional<HBLAS1::HBLAS1V::hblas1_swapv>
            ((hblas1_swapv *)in_stack_fffffffffffff620);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_720,
             "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas1.cxx"
             ,0x58);
  auVar3 = ZEXT1664((undefined1  [16])0x0);
  auVar4 = vmovdqu64_avx512f(auVar3);
  auStack_748 = auVar4._40_24_;
  auVar4 = vmovdqu64_avx512f(auVar3);
  auStack_788 = auVar4._0_24_;
  local_770 = auVar4._24_40_;
  local_7c8 = vmovdqu64_avx512f(auVar3);
  local_808 = vmovdqu64_avx512f(auVar3);
  local_848 = vmovdqu64_avx512f(auVar3);
  local_888 = vmovdqu64_avx512f(auVar3);
  local_8c8 = vmovdqu64_avx512f(auVar3);
  this_01 = (basic_wrap_stringstream<char> *)local_8c8;
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::basic_wrap_stringstream<char>::ref(this_01);
  this = boost::operator<<(in_stack_fffffffffffff620,*in_stack_fffffffffffff618);
  s = boost::operator<<(in_stack_fffffffffffff620,(char (*) [13])in_stack_fffffffffffff618);
  this_00 = boost::operator<<(in_stack_fffffffffffff620,(char (*) [15])in_stack_fffffffffffff618);
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(this_01);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)this,(std_string *)s);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (uVar1,&local_720,0x12,local_730,in_R8,in_R9,pbVar2);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(this_00);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(hblas1_swapv)
{
  // Random Quaternion vector
  std::vector<HAXX::quaternion<double>> X(HBLAS1_VECLEN), Y(HBLAS1_VECLEN);
  for(auto &x : X) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));
  for(auto &x : Y)
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));

  // Make copies
  std::vector<HAXX::quaternion<double>> XC(X),YC(Y);

  // Check swap when both strides are equal
  for(int stride : strides) { 

    std::copy(XC.begin(),XC.end(),X.begin());
    std::copy(YC.begin(),YC.end(),Y.begin());

    int len = HBLAS1_VECLEN/stride;
    HBLAS_SWAPV(len,&X[0],stride,&Y[0],stride);
  
    BOOST_CHECK( 
      std::all_of(indx.begin(),indx.end(),
        [&](int indx) {
          if(indx % stride == 0 and indx != len*stride ) 
            return (X[indx] == YC[indx] and Y[indx] == XC[indx]);
          else
            return (X[indx] == XC[indx] and Y[indx] == YC[indx]);
        }
      )
    );

  }

  // FIXME: Need a test for when strides are not equal
}